

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

int ShowDemoWindowWidgets::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *data)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  char *__dest;
  wchar_t wVar3;
  
  if (data->EventFlag == 0x40000) {
    pwVar2 = (wchar_t *)data->UserData;
    __dest = *(char **)(pwVar2 + 2);
    if (__dest != data->Buf) {
      __assert_fail("my_str->begin() == data->Buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                    ,0x5b2,
                    "static int ShowDemoWindowWidgets()::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *)"
                   );
    }
    wVar1 = data->BufSize;
    wVar3 = pwVar2[1];
    if (wVar3 < wVar1) {
      if (wVar3 == L'\0') {
        wVar3 = L'\b';
      }
      else {
        wVar3 = wVar3 / 2 + wVar3;
      }
      if (wVar3 <= wVar1) {
        wVar3 = wVar1;
      }
      __dest = (char *)ImGui::MemAlloc((long)wVar3);
      if (*(void **)(pwVar2 + 2) != (void *)0x0) {
        memcpy(__dest,*(void **)(pwVar2 + 2),(long)*pwVar2);
        ImGui::MemFree(*(void **)(pwVar2 + 2));
      }
      *(char **)(pwVar2 + 2) = __dest;
      pwVar2[1] = wVar3;
    }
    *pwVar2 = wVar1;
    data->Buf = __dest;
  }
  return 0;
}

Assistant:

static int MyResizeCallback(ImGuiInputTextCallbackData* data)
                {
                    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
                    {
                        ImVector<char>* my_str = (ImVector<char>*)data->UserData;
                        IM_ASSERT(my_str->begin() == data->Buf);
                        my_str->resize(data->BufSize); // NB: On resizing calls, generally data->BufSize == data->BufTextLen + 1
                        data->Buf = my_str->begin();
                    }
                    return 0;
                }